

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

Month month_of_day(DaysInYear days_in_year)

{
  uint uVar1;
  Month MVar2;
  int year;
  bool bVar3;
  
  year = days_in_year.year;
  days_in_months(year);
  if (((ulong)days_in_year & 3) == 0) {
    uVar1 = year * -0x3d70a3d7 + 0x51eb850;
    bVar3 = true;
    if ((uVar1 >> 2 | year * 0x40000000) < 0x28f5c29) {
      bVar3 = (uVar1 >> 4 | year * -0x70000000) < 0xa3d70b;
    }
  }
  else {
    bVar3 = false;
  }
  MVar2 = jan;
  uVar1 = days_in_year.days;
  if ((((((0x1e < (int)uVar1) && (MVar2 = feb, bVar3 + 0x3b <= uVar1)) &&
        (MVar2 = mar, bVar3 + 0x5a <= uVar1)) &&
       ((MVar2 = apr, bVar3 + 0x78 <= uVar1 && (MVar2 = may, bVar3 + 0x97 <= uVar1)))) &&
      ((MVar2 = jun, bVar3 + 0xb5 <= uVar1 &&
       ((MVar2 = jul, bVar3 + 0xd4 <= uVar1 && (MVar2 = aug, bVar3 + 0xf3 <= uVar1)))))) &&
     ((MVar2 = sep, bVar3 + 0x111 <= uVar1 && (MVar2 = oct, bVar3 + 0x130 <= uVar1)))) {
    MVar2 = dec - (uVar1 < (bVar3 | 0x14e));
  }
  return MVar2;
}

Assistant:

Month month_of_day(DaysInYear days_in_year)
{
	auto d = days_in_year.days;
	auto y = days_in_year.year;
	auto months = days_in_months(y);
	auto leap_additive = leapyear(y) ? 1 : 0;
	if (d < 31)
		return Month::jan;
	else if (d < 59 + leap_additive)
		return Month::feb;
	else if (d < 90 + leap_additive)
		return Month::mar;
	else if (d < 120 + leap_additive)
		return Month::apr;
	else if (d < 151 + leap_additive)
		return Month::may;
	else if (d < 181 + leap_additive)
		return Month::jun;
	else if (d < 212 + leap_additive)
		return Month::jul;
	else if (d < 243 + leap_additive)
		return Month::aug;
	else if (d < 273 + leap_additive)
		return Month::sep;
	else if (d < 304 + leap_additive)
		return Month::oct;
	else if (d < 334 + leap_additive)
		return Month::nov;
	else
		return Month::dec;
}